

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_scalar_function_info.cpp
# Opt level: O1

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::CreateScalarFunctionInfo::GetAlterInfo(CreateScalarFunctionInfo *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer *__ptr;
  long *in_RSI;
  _Head_base<0UL,_duckdb::CreateScalarFunctionInfo_*,_false> local_108;
  _Head_base<0UL,_duckdb::CreateScalarFunctionInfo_*,_false> local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  AlterEntryData local_98;
  
  local_d8 = &local_c8;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_d8,in_RSI[2],in_RSI[3] + in_RSI[2]);
  local_f8 = &local_e8;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_f8,in_RSI[6],in_RSI[7] + in_RSI[6]);
  local_b8 = &local_a8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,in_RSI[0x25],in_RSI[0x26] + in_RSI[0x25]);
  paVar1 = &local_98.catalog.field_2;
  if (local_d8 == &local_c8) {
    local_98.catalog.field_2._8_4_ = local_c8._8_4_;
    local_98.catalog.field_2._12_4_ = local_c8._12_4_;
    local_98.catalog._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.catalog._M_dataplus._M_p = (pointer)local_d8;
  }
  paVar2 = &local_98.schema.field_2;
  local_98.catalog._M_string_length = local_d0;
  local_d0 = 0;
  local_c8._M_allocated_capacity._0_4_ = local_c8._M_allocated_capacity._0_4_ & 0xffffff00;
  if (local_f8 == &local_e8) {
    local_98.schema.field_2._8_4_ = local_e8._8_4_;
    local_98.schema.field_2._12_4_ = local_e8._12_4_;
    local_98.schema._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_98.schema._M_dataplus._M_p = (pointer)local_f8;
  }
  paVar3 = &local_98.name.field_2;
  local_98.schema._M_string_length = local_f0;
  local_f0 = 0;
  local_e8._M_allocated_capacity._0_4_ = local_e8._M_allocated_capacity._0_4_ & 0xffffff00;
  if (local_b8 == &local_a8) {
    local_98.name.field_2._8_4_ = local_a8._8_4_;
    local_98.name.field_2._12_4_ = local_a8._12_4_;
    local_98.name._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_98.name._M_dataplus._M_p = (pointer)local_b8;
  }
  local_98.name._M_string_length = local_b0;
  local_b0 = 0;
  local_a8._M_allocated_capacity._0_4_ = local_a8._M_allocated_capacity._0_4_ & 0xffffff00;
  local_98.if_not_found = RETURN_NULL;
  local_f8 = &local_e8;
  local_d8 = &local_c8;
  local_b8 = &local_a8;
  (**(code **)(*in_RSI + 0x18))(&local_108);
  local_100._M_head_impl = local_108._M_head_impl;
  local_108._M_head_impl = (CreateScalarFunctionInfo *)0x0;
  make_uniq_base<duckdb::AlterInfo,duckdb::AddScalarFunctionOverloadInfo,duckdb::AlterEntryData,duckdb::unique_ptr<duckdb::CreateScalarFunctionInfo,std::default_delete<duckdb::CreateScalarFunctionInfo>,true>>
            ((duckdb *)this,&local_98,
             (unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>,_true>
              *)&local_100);
  if (local_100._M_head_impl != (CreateScalarFunctionInfo *)0x0) {
    (*((local_100._M_head_impl)->super_CreateFunctionInfo).super_CreateInfo.super_ParseInfo.
      _vptr_ParseInfo[1])();
  }
  local_100._M_head_impl = (CreateScalarFunctionInfo *)0x0;
  if (local_108._M_head_impl != (CreateScalarFunctionInfo *)0x0) {
    (*((local_108._M_head_impl)->super_CreateFunctionInfo).super_CreateInfo.super_ParseInfo.
      _vptr_ParseInfo[1])();
  }
  local_108._M_head_impl = (CreateScalarFunctionInfo *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p != paVar3) {
    operator_delete(local_98.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.schema._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.catalog._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.catalog._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<AlterInfo> CreateScalarFunctionInfo::GetAlterInfo() const {
	return make_uniq_base<AlterInfo, AddScalarFunctionOverloadInfo>(
	    AlterEntryData(catalog, schema, name, OnEntryNotFound::RETURN_NULL),
	    unique_ptr_cast<CreateInfo, CreateScalarFunctionInfo>(Copy()));
}